

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

string * __thiscall
Assimp::XGLImporter::GetElementName_abi_cxx11_(string *__return_storage_ptr__,XGLImporter *this)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  size_t sVar5;
  
  iVar2 = (*((this->m_reader).
             super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_IIrrXMLReader[0xd])();
  sVar4 = strlen((char *)CONCAT44(extraout_var,iVar2));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (sVar5 = 0; sVar4 != sVar5; sVar5 = sVar5 + 1) {
    iVar3 = tolower((int)((char *)CONCAT44(extraout_var,iVar2))[sVar5]);
    pcVar1[sVar5] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XGLImporter::GetElementName()
{
    const char* s  = m_reader->getNodeName();
    size_t len = strlen(s);

    std::string ret;
    ret.resize(len);

    std::transform(s,s+len,ret.begin(),::tolower);
    return ret;
}